

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O1

Flow __thiscall Dinic::blocking(Dinic *this,int a,Flow val)

{
  uint uVar1;
  int a_00;
  pointer pvVar2;
  pointer piVar3;
  pointer pEVar4;
  pointer piVar5;
  pointer pEVar6;
  Flow FVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  Flow local_48;
  
  if ((val != 0) && (this->T != a)) {
    pvVar2 = (this->g).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)piVar3[a];
    lVar8 = *(long *)&pvVar2[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if (uVar9 < (ulong)((long)*(pointer *)
                               ((long)&pvVar2[a].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar8 >> 2)) {
      do {
        uVar1 = *(uint *)(lVar8 + uVar9 * 4);
        pEVar4 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        a_00 = pEVar4[(int)uVar1].b;
        bVar10 = true;
        if (piVar5[a_00] == piVar5[a] + 1) {
          pEVar4 = pEVar4 + (int)uVar1;
          lVar8 = pEVar4->cap - pEVar4->flow;
          if (val <= lVar8) {
            lVar8 = val;
          }
          FVar7 = blocking(this,a_00,lVar8);
          bVar10 = FVar7 == 0;
          if (!bVar10) {
            pEVar6 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pEVar4 = pEVar6 + (int)uVar1;
            pEVar4->flow = pEVar4->flow + FVar7;
            pEVar6 = pEVar6 + (int)(uVar1 ^ 1);
            pEVar6->flow = pEVar6->flow - FVar7;
            local_48 = FVar7;
          }
        }
        if (!bVar10) {
          return local_48;
        }
        uVar9 = (long)piVar3[a] + 1;
        piVar3[a] = (int)uVar9;
        pvVar2 = (this->g).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = *(long *)&pvVar2[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      } while (uVar9 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar2[a].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - lVar8 >> 2));
    }
    val = 0;
  }
  return val;
}

Assistant:

Flow blocking(int a, Flow val) {
        if (a == T || val == 0) return val;
        for (int &i = pt[a]; i < g[a].size(); i++) {
            int x = g[a][i];
            int b = e[x].b;
            if (d[b] == d[a] + 1) {
                if (Flow added = blocking(b, min(val, e[x].unused()))) {
                    e[x].flow += added;
                    e[x ^ 1].flow -= added;
                    return added;
                }
            }
        }
        return 0;
    }